

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

string * __thiscall
spirv_cross::CompilerGLSL::build_composite_combiner_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,uint32_t return_type,uint32_t *elems,
          uint32_t length)

{
  uint32_t uVar1;
  Variant *pVVar2;
  bool bVar3;
  bool bVar4;
  bool block_like_type;
  SPIRType *pSVar5;
  ulong uVar6;
  SPIRExpression *pSVar7;
  uint32_t base;
  CompilerGLSL *pCVar8;
  ulong uVar9;
  bool bVar10;
  string subop;
  string local_90;
  uint32_t *local_70;
  string local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_48;
  SPIRType *local_40;
  ulong local_38;
  
  local_48 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_48;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  local_90._M_string_length = 0;
  local_90.field_2._M_local_buf[0] = '\0';
  local_70 = elems;
  pSVar5 = Variant::get<spirv_cross::SPIRType>
                     ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                      return_type);
  bVar10 = false;
  if ((*(int *)&(pSVar5->super_IVariant).field_0xc != 0xf) &&
     ((pSVar5->array).super_VectorView<unsigned_int>.buffer_size == 0)) {
    bVar10 = pSVar5->columns == 1;
  }
  if (length != 0) {
    uVar9 = 0;
    bVar4 = false;
    base = 0;
    local_40 = pSVar5;
    local_38 = (ulong)length;
    do {
      uVar6 = (ulong)local_70[uVar9];
      if ((uVar6 < (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.buffer_size)
         && (pVVar2 = (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr,
            pVVar2[uVar6].type == TypeExpression)) {
        pSVar7 = Variant::get<spirv_cross::SPIRExpression>(pVVar2 + uVar6);
        bVar3 = true;
        if (((!bVar10) || (uVar1 = *(uint32_t *)&(pSVar7->super_IVariant).field_0xc, uVar1 == 0)) ||
           (uVar1 != base)) goto LAB_001fe519;
        if (((pSVar7->expression)._M_string_length == 0) ||
           (*(pSVar7->expression)._M_dataplus._M_p != '.')) {
          __assert_fail("!e->expression.empty() && e->expression.front() == \'.\'",
                        "/workspace/llm4binary/github/license_c_cmakelists/Unity-Technologies[P]SPIRV-Cross/spirv_glsl.cpp"
                        ,0x27fa,
                        "string spirv_cross::CompilerGLSL::build_composite_combiner(uint32_t, const uint32_t *, uint32_t)"
                       );
        }
        ::std::__cxx11::string::substr((ulong)&local_68,(ulong)&pSVar7->expression);
        ::std::__cxx11::string::_M_append((char *)&local_90,(ulong)local_68._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != &local_68.field_2) {
          operator_delete(local_68._M_dataplus._M_p);
        }
        bVar4 = true;
LAB_001fe60d:
        base = *(uint32_t *)&(pSVar7->super_IVariant).field_0xc;
      }
      else {
        bVar3 = false;
        pSVar7 = (SPIRExpression *)0x0;
LAB_001fe519:
        if (bVar4) {
          if ((this->backend).swizzle_is_function == true) {
            ::std::__cxx11::string::append((char *)&local_90);
          }
          pCVar8 = this;
          bVar4 = remove_duplicate_swizzle(this,&local_90);
          if (!bVar4) {
            pCVar8 = this;
            remove_unity_swizzle(this,base,&local_90);
          }
          strip_enclosed_expression(pCVar8,&local_90);
          ::std::__cxx11::string::_M_append
                    ((char *)__return_storage_ptr__,(ulong)local_90._M_dataplus._M_p);
          bVar4 = false;
        }
        else {
          ::std::__cxx11::string::_M_append
                    ((char *)__return_storage_ptr__,(ulong)local_90._M_dataplus._M_p);
        }
        if (uVar9 != 0) {
          ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        }
        if (*(int *)&(local_40->super_IVariant).field_0xc == 0xf) {
          block_like_type =
               Compiler::has_member_decoration
                         (&this->super_Compiler,(TypeID)(local_40->super_IVariant).self.id,
                          (uint32_t)uVar9,DecorationOffset);
        }
        else {
          block_like_type = false;
        }
        to_composite_constructor_expression_abi_cxx11_
                  (&local_68,this,local_70[uVar9],block_like_type);
        ::std::__cxx11::string::operator=((string *)&local_90,(string *)&local_68);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != &local_68.field_2) {
          operator_delete(local_68._M_dataplus._M_p);
        }
        base = 0;
        if (bVar3) goto LAB_001fe60d;
      }
      uVar9 = uVar9 + 1;
    } while (local_38 != uVar9);
    if (bVar4) {
      if ((this->backend).swizzle_is_function == true) {
        ::std::__cxx11::string::append((char *)&local_90);
      }
      pCVar8 = this;
      bVar10 = remove_duplicate_swizzle(this,&local_90);
      if (!bVar10) {
        remove_unity_swizzle(this,base,&local_90);
        pCVar8 = this;
      }
      strip_enclosed_expression(pCVar8,&local_90);
    }
  }
  ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_90._M_dataplus._M_p)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::build_composite_combiner(uint32_t return_type, const uint32_t *elems, uint32_t length)
{
	ID base = 0;
	string op;
	string subop;

	// Can only merge swizzles for vectors.
	auto &type = get<SPIRType>(return_type);
	bool can_apply_swizzle_opt = type.basetype != SPIRType::Struct && type.array.empty() && type.columns == 1;
	bool swizzle_optimization = false;

	for (uint32_t i = 0; i < length; i++)
	{
		auto *e = maybe_get<SPIRExpression>(elems[i]);

		// If we're merging another scalar which belongs to the same base
		// object, just merge the swizzles to avoid triggering more than 1 expression read as much as possible!
		if (can_apply_swizzle_opt && e && e->base_expression && e->base_expression == base)
		{
			// Only supposed to be used for vector swizzle -> scalar.
			assert(!e->expression.empty() && e->expression.front() == '.');
			subop += e->expression.substr(1, string::npos);
			swizzle_optimization = true;
		}
		else
		{
			// We'll likely end up with duplicated swizzles, e.g.
			// foobar.xyz.xyz from patterns like
			// OpVectorShuffle
			// OpCompositeExtract x 3
			// OpCompositeConstruct 3x + other scalar.
			// Just modify op in-place.
			if (swizzle_optimization)
			{
				if (backend.swizzle_is_function)
					subop += "()";

				// Don't attempt to remove unity swizzling if we managed to remove duplicate swizzles.
				// The base "foo" might be vec4, while foo.xyz is vec3 (OpVectorShuffle) and looks like a vec3 due to the .xyz tacked on.
				// We only want to remove the swizzles if we're certain that the resulting base will be the same vecsize.
				// Essentially, we can only remove one set of swizzles, since that's what we have control over ...
				// Case 1:
				//  foo.yxz.xyz: Duplicate swizzle kicks in, giving foo.yxz, we are done.
				//               foo.yxz was the result of OpVectorShuffle and we don't know the type of foo.
				// Case 2:
				//  foo.xyz: Duplicate swizzle won't kick in.
				//           If foo is vec3, we can remove xyz, giving just foo.
				if (!remove_duplicate_swizzle(subop))
					remove_unity_swizzle(base, subop);

				// Strips away redundant parens if we created them during component extraction.
				strip_enclosed_expression(subop);
				swizzle_optimization = false;
				op += subop;
			}
			else
				op += subop;

			if (i)
				op += ", ";

			bool uses_buffer_offset =
			    type.basetype == SPIRType::Struct && has_member_decoration(type.self, i, DecorationOffset);
			subop = to_composite_constructor_expression(elems[i], uses_buffer_offset);
		}

		base = e ? e->base_expression : ID(0);
	}

	if (swizzle_optimization)
	{
		if (backend.swizzle_is_function)
			subop += "()";

		if (!remove_duplicate_swizzle(subop))
			remove_unity_swizzle(base, subop);
		// Strips away redundant parens if we created them during component extraction.
		strip_enclosed_expression(subop);
	}

	op += subop;
	return op;
}